

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloorPlanGraph.hpp
# Opt level: O0

void __thiscall
graphProperties::serialize<boost::archive::binary_iarchive>
          (graphProperties *this,binary_iarchive *ar,uint version)

{
  uint version_local;
  binary_iarchive *ar_local;
  graphProperties *this_local;
  
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->floorname);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->filepath);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->maxx);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->maxy);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->minx);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->minx);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator&
            ((interface_iarchive<boost::archive::binary_iarchive> *)ar,&this->centroid);
  return;
}

Assistant:

void serialize(Archive &ar, const unsigned int version)
        {

            ar & floorname;
            ar & filepath;
            ar & maxx;
            ar & maxy;
            ar & minx;
            ar & minx;
            ar & centroid;
        }